

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O0

uint __thiscall Kernel::Term::computeDistinctVars(Term *this)

{
  bool bVar1;
  uint uVar2;
  VariableIterator *in_RDI;
  VariableIterator vit;
  Set<unsigned_int,_Lib::DefaultHash> vars;
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  TermList local_90 [9];
  Term *in_stack_ffffffffffffffb8;
  VariableIterator *in_stack_ffffffffffffffc0;
  Set<unsigned_int,_Lib::DefaultHash> local_30;
  
  Lib::Set<unsigned_int,_Lib::DefaultHash>::Set((Set<unsigned_int,_Lib::DefaultHash> *)0x988449);
  VariableIterator::VariableIterator(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = VariableIterator::hasNext(in_RDI);
    if (!bVar1) break;
    local_90[0] = VariableIterator::next
                            ((VariableIterator *)
                             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    in_stack_ffffffffffffff54 = TermList::var(local_90);
    Lib::Set<unsigned_int,_Lib::DefaultHash>::insert
              ((Set<unsigned_int,_Lib::DefaultHash> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff4c);
  }
  uVar2 = Lib::Set<unsigned_int,_Lib::DefaultHash>::size(&local_30);
  VariableIterator::~VariableIterator((VariableIterator *)CONCAT44(in_stack_ffffffffffffff54,uVar2))
  ;
  Lib::Set<unsigned_int,_Lib::DefaultHash>::~Set
            ((Set<unsigned_int,_Lib::DefaultHash> *)CONCAT44(in_stack_ffffffffffffff54,uVar2));
  return uVar2;
}

Assistant:

unsigned Term::computeDistinctVars() const
{
  Set<unsigned> vars;
  VariableIterator vit(this);
  while (vit.hasNext()) {
    vars.insert(vit.next().var());
  }
  return vars.size();
}